

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
* __thiscall
mjs::parser::parse_function_abi_cxx11_
          (tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
           *__return_storage_ptr__,parser *this)

{
  bool bVar1;
  wchar_t wVar2;
  long lVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer psVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  bool bVar9;
  int iVar10;
  __normal_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  _Var11;
  wostream *pwVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  char *pcVar13;
  wchar_t *extraout_RDX;
  wstring_view *s;
  long lVar14;
  wchar_t *in_R9;
  ulong uVar15;
  wstring_view name;
  wstring_view message;
  wstring_view message_00;
  statement_ptr block;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  params;
  value_type n;
  vector<mjs::source_extend,_std::allocator<mjs::source_extend>_> param_extends;
  wostringstream _oss;
  undefined1 local_2a0 [16];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pbStack_290;
  pointer local_288;
  wstring local_278;
  wstring local_258 [16];
  undefined8 local_248 [2];
  vector<mjs::source_extend,_std::allocator<mjs::source_extend>_> local_238;
  undefined1 local_218 [32];
  undefined1 local_1f8 [376];
  token local_80;
  token local_58;
  
  local_218._0_8_ = (this->lexer_).text_pos_;
  pcVar13 = "parse_function";
  local_218._8_8_ = __return_storage_ptr__;
  expect(&local_58,this,lparen,"parse_function",0x288);
  token::destroy(&local_58);
  local_288 = (pointer)0x0;
  local_2a0._8_8_ =
       (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)0x0;
  pbStack_290 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)0x0;
  local_238.super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  accept((parser *)local_1f8,(int)this,(sockaddr *)0x2f,(socklen_t *)pcVar13);
  uVar8 = local_1f8._0_4_;
  token::destroy((token *)local_1f8);
  if (uVar8 == eof) {
    do {
      local_1f8._0_8_ =
           (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1f8._8_8_ =
           (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_)->_M_use_count + 1;
        }
      }
      local_1f8._16_4_ = this->token_start_;
      local_1f8._20_4_ = *(undefined4 *)&(this->lexer_).text_pos_;
      std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::
      emplace_back<mjs::source_extend>(&local_238,(source_extend *)local_1f8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
      }
      pcVar13 = "parse_function";
      expect((token *)local_1f8,this,identifier,"parse_function",0x28e);
      if ((local_1f8._0_4_ != identifier) && (local_1f8._0_4_ != string_literal)) {
        __assert_fail("has_text()",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h"
                      ,0xd6,"const std::wstring &mjs::token::text() const");
      }
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)(local_2a0 + 8),(value_type *)(local_1f8 + 8));
      token::destroy((token *)local_1f8);
      accept((parser *)local_1f8,(int)this,(sockaddr *)0x20,(socklen_t *)pcVar13);
      uVar8 = local_1f8._0_4_;
      token::destroy((token *)local_1f8);
    } while (uVar8 != eof);
    expect(&local_80,this,rparen,"parse_function",0x290);
    token::destroy(&local_80);
  }
  bVar1 = this->strict_mode_;
  parse_block((parser *)local_2a0,SUB81(this,0));
  wVar2 = (((wstring *)(local_2a0._0_8_ + 8))->field_2)._M_local_buf[1];
  iVar10 = (**(code **)(*(long *)local_2a0._0_8_ + 0x18))();
  if (iVar10 != 0) {
    __assert_fail("block->type() == statement_type::block",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x296,"auto mjs::parser::parse_function()");
  }
  if (((*(char *)&((wstring *)(local_2a0._0_8_ + 0x28))->field_2 == '\x01') &&
      (this->skip_strict_checks_for_first_function_ == false)) &&
     (pbStack_290 !=
      (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_2a0._8_8_)
     ) {
    lVar14 = 0x20;
    iVar10 = 0;
    uVar15 = 0;
    do {
      local_258._0_8_ = local_248;
      lVar3 = *(long *)((long)&(((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                  *)(local_2a0._8_8_ + -0x20))->_M_dataplus)._M_p + lVar14);
      std::__cxx11::wstring::_M_construct<wchar_t*>
                (local_258,lVar3,lVar3 + *(long *)(local_2a0._8_8_ + lVar14 + -0x18) * 4);
      name._M_str = extraout_RDX;
      name._M_len._0_1_ = local_258[0];
      name._M_len._1_1_ = local_258[1];
      name._M_len._2_1_ = local_258[2];
      name._M_len._3_1_ = local_258[3];
      name._M_len._4_1_ = local_258[4];
      name._M_len._5_1_ = local_258[5];
      name._M_len._6_1_ = local_258[6];
      name._M_len._7_1_ = local_258[7];
      bVar9 = is_strict_mode_unassignable_identifier((mjs *)local_258._8_8_,name);
      if (bVar9) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1f8);
        pwVar12 = std::operator<<((wostream *)local_1f8,"\"");
        local_218[0x10] = local_258[8];
        local_218[0x11] = local_258[9];
        local_218[0x12] = local_258[10];
        local_218[0x13] = local_258[0xb];
        local_218[0x14] = local_258[0xc];
        local_218[0x15] = local_258[0xd];
        local_218[0x16] = local_258[0xe];
        local_218[0x17] = local_258[0xf];
        local_218[0x18] = local_258[0];
        local_218[0x19] = local_258[1];
        local_218[0x1a] = local_258[2];
        local_218[0x1b] = local_258[3];
        local_218[0x1c] = local_258[4];
        local_218[0x1d] = local_258[5];
        local_218[0x1e] = local_258[6];
        local_218[0x1f] = local_258[7];
        cpp_quote_abi_cxx11_(&local_278,(mjs *)(local_218 + 0x10),s);
        pwVar12 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                            (pwVar12,local_278._M_dataplus._M_p,local_278._M_string_length);
        std::operator<<(pwVar12,"\" may not be used as a parameter name in strict mode");
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        psVar6 = local_238.
                 super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl
                 .super__Vector_impl_data._M_start;
        std::__cxx11::wstringbuf::str();
        message._M_str = in_R9;
        message._M_len = (size_t)local_278._M_dataplus._M_p;
        syntax_error((parser *)"parse_function",(char *)0x29b,(int)psVar6 + iVar10,
                     (source_extend *)local_278._M_string_length,message);
      }
      _Var11 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::wstring*,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::wstring_const>>
                         ((long)&((_Alloc_hider *)local_2a0._8_8_)->_M_p + lVar14,pbStack_290,
                          local_258);
      if (_Var11._M_current != pbStack_290) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1f8);
        std::operator<<((wostream *)local_1f8,"Parameter names may not be repeated in strict mode");
        psVar6 = local_238.
                 super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl
                 .super__Vector_impl_data._M_start;
        std::__cxx11::wstringbuf::str();
        message_00._M_str = in_R9;
        message_00._M_len = (size_t)local_278._M_dataplus._M_p;
        syntax_error((parser *)"parse_function",(char *)0x29e,(int)psVar6 + iVar10,
                     (source_extend *)local_278._M_string_length,message_00);
      }
      if ((undefined8 *)local_258._0_8_ != local_248) {
        operator_delete((void *)local_258._0_8_,local_248[0] * 4 + 4);
      }
      uVar15 = uVar15 + 1;
      iVar10 = iVar10 + 0x18;
      lVar14 = lVar14 + 0x20;
    } while (uVar15 < (ulong)((long)pbStack_290 - local_2a0._8_8_ >> 5));
  }
  uVar7 = local_218._8_8_;
  this->skip_strict_checks_for_first_function_ = false;
  peVar4 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  *(undefined8 *)local_218._8_8_ = local_2a0._0_8_;
  (((_Head_base<1UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_false>
     *)(local_218._8_8_ + 8))->_M_head_impl).
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2a0._8_8_;
  *(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> **)
   (local_218._8_8_ + 0x10) = pbStack_290;
  *(pointer *)(local_218._8_8_ + 0x18) = local_288;
  (((_Head_base<0UL,_mjs::source_extend,_false> *)(local_218._8_8_ + 0x20))->_M_head_impl).file.
  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_218._8_8_ + 0x28))->_M_pi = p_Var5;
  *(ulong *)(local_218._8_8_ + 0x30) =
       (ulong)(uint)wVar2 << 0x20 | local_218._0_8_ + 0xffffffff & 0xffffffff;
  local_288 = (pointer)0x0;
  pbStack_290 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)0x0;
  local_2a0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2a0._0_8_ = (element_type *)0x0;
  this->strict_mode_ = bVar1;
  std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::~vector(&local_238);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)(local_2a0 + 8));
  return (tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
          *)uVar7;
}

Assistant:

auto parse_function() {
        const auto body_start = lexer_.text_position() - 1;
        EXPECT(token_type::lparen);
        std::vector<std::wstring> params;
        std::vector<source_extend> param_extends;
        if (!accept(token_type::rparen)) {
            do {
                param_extends.push_back(current_extend());
                params.push_back(EXPECT(token_type::identifier).text());
            } while (accept(token_type::comma));
            EXPECT(token_type::rparen);
        }
        scoped_strict_mode ssm{*this};   // Make sure state is restored afterwards
        auto block = parse_block(version_ >= version::es5);
        const auto body_end = block->extend().end;

        assert(block->type() == statement_type::block);
        if (static_cast<const block_statement&>(*block).strict_mode() && !skip_strict_checks_for_first_function_) {
            for (size_t i = 0; i < params.size(); ++i) {
                auto n = params[i];
                if (is_strict_mode_unassignable_identifier(n)) {
                    SYNTAX_ERROR_AT("\"" << cpp_quote(n) << "\" may not be used as a parameter name in strict mode", param_extends[i]);
                }
                if (std::find(params.begin() + i + 1, params.end(), n) != params.end()) {
                    SYNTAX_ERROR_AT("Parameter names may not be repeated in strict mode", param_extends[i]);
                }
            }
        }
        skip_strict_checks_for_first_function_ = false;

        return std::make_tuple(source_extend{source_, body_start, body_end}, std::move(params), std::move(block));
    }